

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmSourceFile * __thiscall cmMakefile::GetSource(cmMakefile *this,string *sourceName)

{
  bool bVar1;
  cmSourceFile *this_00;
  pointer ppcVar2;
  cmSourceFileLocation sfl;
  cmSourceFileLocation local_70;
  
  cmSourceFileLocation::cmSourceFileLocation(&local_70,this,sourceName);
  ppcVar2 = (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar2 !=
      (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppcVar2;
      bVar1 = cmSourceFile::Matches(this_00,&local_70);
      if (bVar1) goto LAB_00394acd;
      ppcVar2 = ppcVar2 + 1;
    } while (ppcVar2 !=
             (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  this_00 = (cmSourceFile *)0x0;
LAB_00394acd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.Name._M_dataplus._M_p != &local_70.Name.field_2) {
    operator_delete(local_70.Name._M_dataplus._M_p,local_70.Name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.Directory._M_dataplus._M_p != &local_70.Directory.field_2) {
    operator_delete(local_70.Directory._M_dataplus._M_p,
                    local_70.Directory.field_2._M_allocated_capacity + 1);
  }
  return this_00;
}

Assistant:

cmSourceFile* cmMakefile::GetSource(const std::string& sourceName) const
{
  cmSourceFileLocation sfl(this, sourceName);
  for(std::vector<cmSourceFile*>::const_iterator
        sfi = this->SourceFiles.begin();
      sfi != this->SourceFiles.end(); ++sfi)
    {
    cmSourceFile* sf = *sfi;
    if(sf->Matches(sfl))
      {
      return sf;
      }
    }
  return 0;
}